

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
libcellml::Parser::ParserImpl::loadReset
          (ParserImpl *this,ResetPtr *reset,ComponentPtr *component,XmlNodePtr *node)

{
  IssueImpl *pIVar1;
  Entity *this_00;
  _Alloc_hider _Var2;
  bool bVar3;
  bool bVar4;
  undefined8 uVar5;
  size_t count;
  string variableReference;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  XmlNodePtr childNode;
  IssuePtr issue_5;
  XmlAttributePtr attribute;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined8 local_d8;
  IssuePtr issue_2;
  IssuePtr issue;
  int order;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  XmlNodePtr *local_58;
  string local_50;
  
  order = 0;
  local_58 = node;
  XmlNode::firstAttribute((XmlNode *)&attribute);
  bVar4 = false;
  local_d8 = (ulong)local_d8._4_4_ << 0x20;
  do {
    if (attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (bVar4) {
        Reset::setOrder((reset->super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr,order);
      }
      else if ((local_d8 & 1) == 0) {
        Issue::IssueImpl::create();
        pIVar1 = (issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        NamedEntity::name_abi_cxx11_
                  (&local_168,
                   (NamedEntity *)
                   (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr);
        std::operator+(&local_f8,"Reset in component \'",&local_168);
        std::operator+(&variableReference,&local_f8,"\' does not have its order set.");
        Issue::IssueImpl::setDescription(pIVar1,&variableReference);
        std::__cxx11::string::~string((string *)&variableReference);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_168);
        AnyCellmlElement::AnyCellmlElementImpl::setReset
                  ((((issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,reset,RESET);
        Issue::IssueImpl::setReferenceRule
                  ((issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl,RESET_ORDER_VALUE);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_5);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      XmlNode::firstChild((XmlNode *)&childNode);
      count = 0;
      local_d8 = 0;
      while (childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0) {
        bVar4 = XmlNode::isCellml20Element
                          (childNode.
                           super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           ,"test_value");
        if (bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&variableReference,"test_value",(allocator<char> *)&local_f8);
          loadResetChild(this,&variableReference,reset,component,
                         (XmlNodePtr *)
                         &childNode.
                          super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>);
          std::__cxx11::string::~string((string *)&variableReference);
          count = count + 1;
        }
        else {
          bVar4 = XmlNode::isCellml20Element
                            (childNode.
                             super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,"reset_value");
          if (bVar4) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&variableReference,"reset_value",(allocator<char> *)&local_f8);
            loadResetChild(this,&variableReference,reset,component,
                           (XmlNodePtr *)
                           &childNode.
                            super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>);
            std::__cxx11::string::~string((string *)&variableReference);
            local_d8 = local_d8 + 1;
          }
          else {
            bVar4 = XmlNode::isText(childNode.
                                    super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
            if (bVar4) {
              XmlNode::convertToString_abi_cxx11_
                        (&variableReference,
                         childNode.
                         super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
              bVar4 = hasNonWhitespaceCharacters(&variableReference);
              if (bVar4) {
                Issue::IssueImpl::create();
                pIVar1 = (issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl;
                std::operator+(&local_168,
                               "Reset has an invalid non-whitespace child text element \'",
                               &variableReference);
                std::operator+(&local_f8,&local_168,
                               "\'. Either a test_value block or a reset_value block is expected.");
                Issue::IssueImpl::setDescription(pIVar1,&local_f8);
                std::__cxx11::string::~string((string *)&local_f8);
                std::__cxx11::string::~string((string *)&local_168);
                AnyCellmlElement::AnyCellmlElementImpl::setReset
                          ((((issue_5.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mPimpl->mItem).
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl,reset,RESET);
                Issue::IssueImpl::setReferenceRule
                          ((issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl,XML_UNEXPECTED_CHARACTER);
                Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_5);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
              }
              std::__cxx11::string::~string((string *)&variableReference);
            }
            else {
              bVar4 = XmlNode::isComment(childNode.
                                         super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
              if (!bVar4) {
                Issue::IssueImpl::create();
                pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl;
                NamedEntity::name_abi_cxx11_
                          (&local_78,
                           (NamedEntity *)
                           (component->
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &issue_5,"Reset in component \'",&local_78);
                std::operator+(&local_168,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &issue_5,"\' has an invalid child \'");
                XmlNode::name_abi_cxx11_
                          (&local_98,
                           childNode.
                           super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          );
                std::operator+(&local_f8,&local_168,&local_98);
                std::operator+(&variableReference,&local_f8,"\'.");
                Issue::IssueImpl::setDescription(pIVar1,&variableReference);
                std::__cxx11::string::~string((string *)&variableReference);
                std::__cxx11::string::~string((string *)&local_f8);
                std::__cxx11::string::~string((string *)&local_98);
                std::__cxx11::string::~string((string *)&local_168);
                std::__cxx11::string::~string((string *)&issue_5);
                std::__cxx11::string::~string((string *)&local_78);
                AnyCellmlElement::AnyCellmlElementImpl::setReset
                          ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->mPimpl->mItem).
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl,reset,RESET);
                Issue::IssueImpl::setReferenceRule
                          ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->mPimpl,XML_UNEXPECTED_ELEMENT);
                Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
            }
          }
        }
        XmlNode::next((XmlNode *)&variableReference);
        std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)
                   &variableReference);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&variableReference._M_string_length
                  );
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&variableReference,"test_value",(allocator<char> *)&local_f8);
      checkResetChildMultiplicity(this,count,&variableReference,reset,component);
      std::__cxx11::string::~string((string *)&variableReference);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&variableReference,"reset_value",(allocator<char> *)&local_f8);
      checkResetChildMultiplicity(this,local_d8,&variableReference,reset,component);
      std::__cxx11::string::~string((string *)&variableReference);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return;
    }
    bVar3 = XmlAttribute::isType
                      (attribute.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,"variable","");
    if (bVar3) {
      XmlAttribute::value_abi_cxx11_
                (&variableReference,
                 attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      Component::variable((Component *)&childNode,
                          (string *)
                          (component->
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr);
      if (childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        Issue::IssueImpl::create();
        pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        std::operator+(&local_78,"Reset referencing variable \'",&variableReference);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_5
                       ,&local_78,"\' is not a valid reference for a variable in component \'");
        NamedEntity::name_abi_cxx11_
                  (&local_98,
                   (NamedEntity *)
                   (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr);
        std::operator+(&local_168,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_5
                       ,&local_98);
        std::operator+(&local_f8,&local_168,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&issue_5);
        std::__cxx11::string::~string((string *)&local_78);
        AnyCellmlElement::AnyCellmlElementImpl::setReset
                  ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,reset,RESET);
        Issue::IssueImpl::setReferenceRule
                  ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl,RESET_VARIABLE_REFERENCE);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
LAB_00201ad5:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        Reset::setVariable((reset->super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr,(VariablePtr *)&childNode);
      }
LAB_00201ae2:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
LAB_00201aec:
      std::__cxx11::string::~string((string *)&variableReference);
    }
    else {
      bVar3 = XmlAttribute::isType
                        (attribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,"test_variable","");
      if (bVar3) {
        XmlAttribute::value_abi_cxx11_
                  (&variableReference,
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        Component::variable((Component *)&childNode,
                            (string *)
                            (component->
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr);
        if (childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          Issue::IssueImpl::create();
          pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl;
          std::operator+(&local_78,"Reset referencing test_variable \'",&variableReference);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_5,&local_78,
                         "\' is not a valid reference for a variable in component \'");
          NamedEntity::name_abi_cxx11_
                    (&local_98,
                     (NamedEntity *)
                     (component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          std::operator+(&local_168,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_5,&local_98);
          std::operator+(&local_f8,&local_168,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&issue_5);
          std::__cxx11::string::~string((string *)&local_78);
          AnyCellmlElement::AnyCellmlElementImpl::setReset
                    ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,reset,RESET);
          Issue::IssueImpl::setReferenceRule
                    ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl,RESET_TEST_VARIABLE_REFERENCE);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
          goto LAB_00201ad5;
        }
        Reset::setTestVariable
                  ((reset->super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                   (VariablePtr *)&childNode);
        goto LAB_00201ae2;
      }
      bVar3 = XmlAttribute::isType
                        (attribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,"order","");
      if (!bVar3) {
        bVar3 = XmlAttribute::isType
                          (attribute.
                           super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,"id","");
        if (!bVar3) {
          Issue::IssueImpl::create();
          pIVar1 = (IssueImpl *)
                   childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr[1].mPimpl;
          NamedEntity::name_abi_cxx11_
                    (&local_78,
                     (NamedEntity *)
                     (component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_5,"Reset in component \'",&local_78);
          std::operator+(&local_168,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_5,"\' has an invalid attribute \'");
          XmlAttribute::name_abi_cxx11_
                    (&local_98,
                     attribute.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          std::operator+(&local_f8,&local_168,&local_98);
          std::operator+(&variableReference,&local_f8,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&variableReference);
          std::__cxx11::string::~string((string *)&variableReference);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)&issue_5);
          std::__cxx11::string::~string((string *)&local_78);
          AnyCellmlElement::AnyCellmlElementImpl::setReset
                    ((AnyCellmlElementImpl *)
                     (childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr[1].mPimpl[5].mXmlNodePtr)->_private,reset,RESET);
          Issue::IssueImpl::setReferenceRule
                    ((IssueImpl *)
                     childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr[1].mPimpl,RESET_ATTRIBUTE_REQUIRED);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&childNode);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          goto LAB_00201af4;
        }
        this_00 = (Entity *)
                  (reset->super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        XmlAttribute::value_abi_cxx11_
                  (&variableReference,
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        Entity::setId(this_00,&variableReference);
        goto LAB_00201aec;
      }
      XmlAttribute::value_abi_cxx11_
                (&variableReference,
                 attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      bVar4 = isCellMLInteger(&variableReference);
      std::__cxx11::string::~string((string *)&variableReference);
      if (bVar4) {
        XmlAttribute::value_abi_cxx11_
                  (&variableReference,
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        bVar4 = convertToInt(&variableReference,&order);
        uVar5 = std::__cxx11::string::~string((string *)&variableReference);
        local_d8 = CONCAT44(local_d8._4_4_,(int)CONCAT71((int7)((ulong)uVar5 >> 8),1));
        if (bVar4) {
          bVar4 = true;
          goto LAB_00201af4;
        }
        variableReference._M_dataplus._M_p = (pointer)&variableReference.field_2;
        variableReference._M_string_length = 0;
        variableReference.field_2._M_local_buf[0] = '\0';
        Reset::variable((Reset *)&local_f8);
        _Var2._M_p = local_f8._M_dataplus._M_p;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
        if (_Var2._M_p != (pointer)0x0) {
          Reset::variable((Reset *)&local_168);
          NamedEntity::name_abi_cxx11_(&local_f8,(NamedEntity *)local_168._M_dataplus._M_p);
          std::__cxx11::string::operator=((string *)&variableReference,(string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_168._M_string_length);
        }
        Issue::IssueImpl::create();
        pIVar1 = (issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        NamedEntity::name_abi_cxx11_
                  ((string *)&issue,
                   (NamedEntity *)
                   (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &childNode,"Reset in component \'",(string *)&issue);
        std::operator+(&local_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &childNode,"\' referencing variable \'");
        std::operator+(&local_78,&local_98,&variableReference);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_5
                       ,&local_78,"\' has an out of range integer order value \'");
        XmlAttribute::value_abi_cxx11_
                  (&local_50,
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        std::operator+(&local_168,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_5
                       ,&local_50);
        std::operator+(&local_f8,&local_168,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&issue_5);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&childNode);
        std::__cxx11::string::~string((string *)&issue);
        AnyCellmlElement::AnyCellmlElementImpl::setReset
                  ((((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,reset,RESET);
        Issue::IssueImpl::setReferenceRule
                  ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl,RESET_ORDER_VALUE);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_2);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&variableReference);
      }
      else {
        variableReference._M_dataplus._M_p = (pointer)&variableReference.field_2;
        variableReference._M_string_length = 0;
        variableReference.field_2._M_local_buf[0] = '\0';
        Reset::variable((Reset *)&local_f8);
        _Var2._M_p = local_f8._M_dataplus._M_p;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
        if (_Var2._M_p != (pointer)0x0) {
          Reset::variable((Reset *)&local_168);
          NamedEntity::name_abi_cxx11_(&local_f8,(NamedEntity *)local_168._M_dataplus._M_p);
          std::__cxx11::string::operator=((string *)&variableReference,(string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_168._M_string_length);
        }
        Issue::IssueImpl::create();
        pIVar1 = (issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        NamedEntity::name_abi_cxx11_
                  ((string *)&issue,
                   (NamedEntity *)
                   (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &childNode,"Reset in component \'",(string *)&issue);
        std::operator+(&local_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &childNode,"\' referencing variable \'");
        std::operator+(&local_78,&local_98,&variableReference);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_5
                       ,&local_78,"\' has a non-integer order value \'");
        XmlAttribute::value_abi_cxx11_
                  (&local_50,
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        std::operator+(&local_168,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_5
                       ,&local_50);
        std::operator+(&local_f8,&local_168,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&issue_5);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&childNode);
        std::__cxx11::string::~string((string *)&issue);
        AnyCellmlElement::AnyCellmlElementImpl::setReset
                  ((((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,reset,RESET);
        Issue::IssueImpl::setReferenceRule
                  ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl,RESET_ORDER_VALUE);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_2);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        uVar5 = std::__cxx11::string::~string((string *)&variableReference);
        local_d8 = CONCAT44(local_d8._4_4_,(int)CONCAT71((int7)((ulong)uVar5 >> 8),1));
      }
      bVar4 = false;
    }
LAB_00201af4:
    XmlAttribute::next((XmlAttribute *)&variableReference);
    std::__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2> *)
               &variableReference);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&variableReference._M_string_length);
  } while( true );
}

Assistant:

void Parser::ParserImpl::loadReset(const ResetPtr &reset, const ComponentPtr &component, const XmlNodePtr &node)
{
    int order = 0;
    bool orderValid = false;
    bool orderDefined = false;

    XmlAttributePtr attribute = node->firstAttribute();
    while (attribute != nullptr) {
        if (attribute->isType("variable")) {
            const std::string variableReference = attribute->value();
            VariablePtr referencedVariable = component->variable(variableReference);

            if (referencedVariable == nullptr) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset referencing variable '" + variableReference + "' is not a valid reference for a variable in component '" + component->name() + "'.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_VARIABLE_REFERENCE);
                addIssue(issue);
            } else {
                reset->setVariable(referencedVariable);
            }
        } else if (attribute->isType("test_variable")) {
            const std::string testVariableReference = attribute->value();
            VariablePtr testVariable = component->variable(testVariableReference);
            if (testVariable == nullptr) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset referencing test_variable '" + testVariableReference + "' is not a valid reference for a variable in component '" + component->name() + "'.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_TEST_VARIABLE_REFERENCE);
                addIssue(issue);
            } else {
                reset->setTestVariable(testVariable);
            }
        } else if (attribute->isType("order")) {
            orderDefined = true;
            orderValid = isCellMLInteger(attribute->value());
            if (orderValid) {
                orderValid = convertToInt(attribute->value(), order);
                if (!orderValid) {
                    std::string variableName;
                    if (reset->variable() != nullptr) {
                        variableName = reset->variable()->name();
                    }
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Reset in component '" + component->name() + "' referencing variable '" + variableName + "' has an out of range integer order value '" + attribute->value() + "'.");
                    issue->mPimpl->mItem->mPimpl->setReset(reset);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ORDER_VALUE);
                    addIssue(issue);
                }
            } else { // This value won't be saved for validation later, so it does need to be reported now.
                std::string variableName;
                if (reset->variable() != nullptr) {
                    variableName = reset->variable()->name();
                }
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset in component '" + component->name() + "' referencing variable '" + variableName + "' has a non-integer order value '" + attribute->value() + "'.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ORDER_VALUE);
                addIssue(issue);
            }
        } else if (attribute->isType("id")) {
            reset->setId(attribute->value());
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Reset in component '" + component->name() + "' has an invalid attribute '" + attribute->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setReset(reset);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ATTRIBUTE_REQUIRED);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (orderValid) {
        reset->setOrder(order);
    } else if (!orderDefined) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Reset in component '" + component->name() + "' does not have its order set.");
        issue->mPimpl->mItem->mPimpl->setReset(reset);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ORDER_VALUE);
        addIssue(issue);
    }

    XmlNodePtr childNode = node->firstChild();

    size_t testValueCount = 0;
    size_t resetValueCount = 0;
    while (childNode != nullptr) {
        if (childNode->isCellml20Element("test_value")) {
            loadResetChild("test_value", reset, component, childNode);
            testValueCount++;
        } else if (childNode->isCellml20Element("reset_value")) {
            loadResetChild("reset_value", reset, component, childNode);
            resetValueCount++;
        } else if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Reset has an invalid non-whitespace child text element '" + textNode + "'. Either a test_value block or a reset_value block is expected.");
                issue->mPimpl->mItem->mPimpl->setReset(reset);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Reset in component '" + component->name() + "' has an invalid child '" + childNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setReset(reset);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            addIssue(issue);
        }
        childNode = childNode->next();
    }

    checkResetChildMultiplicity(testValueCount, "test_value", reset, component);
    checkResetChildMultiplicity(resetValueCount, "reset_value", reset, component);
}